

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

void __thiscall tcmalloc::PageHeap::Delete(PageHeap *this,Span *span)

{
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  local_20.lock_ = &this->lock_;
  SpinLock::Lock(local_20.lock_);
  DeleteLocked(this,span);
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

void PageHeap::Delete(Span* span) {
  SpinLockHolder h(&lock_);
  DeleteLocked(span);
}